

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessingValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)2003>(Result *__return_storage_ptr__,Model *format)

{
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  long *plVar4;
  ostream *poVar5;
  char *pcVar6;
  stringstream *this_00;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar7;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_01;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  FeatureType inputType;
  RepeatedField<long> arrayOutputShape;
  RepeatedField<long> arrayInputShape;
  FeatureType outputType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  Result result;
  stringstream out;
  string local_1a8 [8];
  ostream local_1a0 [376];
  
  puVar7 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar7 == (ModelDescription *)0x0) {
    puVar7 = Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 0x7d3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&out,"Model not a sound analysis preprocessing.",(allocator<char> *)&result
              );
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&out);
    this_00 = &out;
    goto LAB_0028675e;
  }
  Result::Result(&result);
  outputType.super_MessageLite._vptr_MessageLite._0_4_ = 5;
  __l._M_len = 1;
  __l._M_array = (iterator)&outputType;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)&inputType,__l,(allocator_type *)&local_1f8);
  this = &((ModelDescription *)puVar7)->input_;
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)&out,(CoreML *)this,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&inputType,
             in_R8);
  Result::operator=(&result,(Result *)&out);
  std::__cxx11::string::~string(local_1a8);
  std::
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                   *)&inputType);
  bVar2 = Result::good(&result);
  if (bVar2) {
    outputType.super_MessageLite._vptr_MessageLite._0_4_ = 5;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&outputType;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&inputType,__l_00,(allocator_type *)&local_1f8);
    this_01 = &((ModelDescription *)puVar7)->output_;
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&out,(CoreML *)this_01,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&inputType,
               in_R8);
    Result::operator=(&result,(Result *)&out);
    std::__cxx11::string::~string(local_1a8);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     *)&inputType);
    bVar2 = Result::good(&result);
    if (!bVar2) goto LAB_00286746;
    if (format->_oneof_case_[0] == 0x7d3) {
      puVar7 = (undefined1 *)(format->Type_).supportvectorclassifier_;
    }
    else {
      puVar7 = Specification::CoreMLModels::_SoundAnalysisPreprocessing_default_instance_;
    }
    iVar1 = *(int *)((long)&(((SupportVectorClassifier *)puVar7)->numberofsupportvectorsperclass_).
                            arena_or_elements_ + 4);
    if (iVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&out,"Type for sound analysis preprocessing not set",
                 (allocator<char> *)&inputType);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&out);
      std::__cxx11::string::~string((string *)&out);
    }
    else {
      if (iVar1 != 0x14) goto LAB_00286746;
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,0);
      puVar7 = (undefined1 *)pTVar3->type_;
      if ((FeatureType *)puVar7 == (FeatureType *)0x0) {
        puVar7 = Specification::_FeatureType_default_instance_;
      }
      if (((FeatureType *)puVar7)->_oneof_case_[0] == 5) {
        puVar7 = (undefined1 *)(((FeatureType *)puVar7)->Type_).multiarraytype_;
      }
      else {
        puVar7 = Specification::_ArrayFeatureType_default_instance_;
      }
      google::protobuf::RepeatedField<long>::RepeatedField
                (&arrayInputShape,&((ArrayFeatureType *)puVar7)->shape_);
      if ((arrayInputShape.current_size_ == 1) &&
         (plVar4 = google::protobuf::RepeatedField<long>::Mutable(&arrayInputShape,0),
         *plVar4 == 0x3cf0)) {
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,0);
        puVar7 = (undefined1 *)pTVar3->type_;
        if ((FeatureType *)puVar7 == (FeatureType *)0x0) {
          puVar7 = Specification::_FeatureType_default_instance_;
        }
        Specification::FeatureType::FeatureType(&inputType,(FeatureType *)puVar7);
        puVar7 = (undefined1 *)inputType.Type_;
        if (inputType._oneof_case_[0] != 5) {
          puVar7 = Specification::_ArrayFeatureType_default_instance_;
        }
        if (((ArrayFeatureType *)puVar7)->datatype_ == 0x10020) {
          pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                             (&this_01->super_RepeatedPtrFieldBase,0);
          puVar7 = (undefined1 *)pTVar3->type_;
          if ((FeatureType *)puVar7 == (FeatureType *)0x0) {
            puVar7 = Specification::_FeatureType_default_instance_;
          }
          if (((FeatureType *)puVar7)->_oneof_case_[0] == 5) {
            puVar7 = (undefined1 *)(((FeatureType *)puVar7)->Type_).multiarraytype_;
          }
          else {
            puVar7 = Specification::_ArrayFeatureType_default_instance_;
          }
          google::protobuf::RepeatedField<long>::RepeatedField
                    (&arrayOutputShape,&((ArrayFeatureType *)puVar7)->shape_);
          if ((((arrayOutputShape.current_size_ == 3) &&
               (plVar4 = google::protobuf::RepeatedField<long>::Mutable(&arrayOutputShape,0),
               *plVar4 == 1)) &&
              (plVar4 = google::protobuf::RepeatedField<long>::Mutable(&arrayOutputShape,1),
              *plVar4 == 0x60)) &&
             (plVar4 = google::protobuf::RepeatedField<long>::Mutable(&arrayOutputShape,2),
             *plVar4 == 0x40)) {
            pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (&this_01->super_RepeatedPtrFieldBase,0);
            puVar7 = (undefined1 *)pTVar3->type_;
            if ((FeatureType *)puVar7 == (FeatureType *)0x0) {
              puVar7 = Specification::_FeatureType_default_instance_;
            }
            Specification::FeatureType::FeatureType(&outputType,(FeatureType *)puVar7);
            puVar7 = (undefined1 *)outputType.Type_;
            if (outputType._oneof_case_[0] != 5) {
              puVar7 = Specification::_ArrayFeatureType_default_instance_;
            }
            if (((ArrayFeatureType *)puVar7)->datatype_ == 0x10020) {
              Specification::FeatureType::~FeatureType(&outputType);
              google::protobuf::RepeatedField<long>::~RepeatedField(&arrayOutputShape);
              Specification::FeatureType::~FeatureType(&inputType);
              google::protobuf::RepeatedField<long>::~RepeatedField(&arrayInputShape);
              goto LAB_00286746;
            }
            std::__cxx11::stringstream::stringstream((stringstream *)&out);
            poVar5 = std::operator<<(local_1a0,"Unsupported array type \"");
            puVar7 = (undefined1 *)outputType.Type_;
            if (outputType._oneof_case_[0] != 5) {
              puVar7 = Specification::_ArrayFeatureType_default_instance_;
            }
            pcVar6 = MLArrayDataType_Name(((SequenceFeatureType *)puVar7)->_oneof_case_[0]);
            poVar5 = std::operator<<(poVar5,pcVar6);
            poVar5 = std::operator<<(poVar5,"\" for feature \"");
            pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (&this->super_RepeatedPtrFieldBase,0);
            std::operator+(&local_1f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(pTVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),"\". ");
            poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
            poVar5 = std::operator<<(poVar5,"Should be of: ");
            poVar5 = std::operator<<(poVar5,"MLArrayDataTypeFLOAT32");
            poVar5 = std::operator<<(poVar5,".");
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::stringbuf::str();
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1f8
                          );
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::stringstream::~stringstream((stringstream *)&out);
            Specification::FeatureType::~FeatureType(&outputType);
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)&out);
            poVar5 = std::operator<<(local_1a0,
                                     "Incorrect output shape, should be 3-dimension, of size: ");
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,1);
            poVar5 = std::operator<<(poVar5,"x");
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x60);
            poVar5 = std::operator<<(poVar5,"x");
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x40);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__cxx11::stringbuf::str();
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                           (string *)&outputType);
            std::__cxx11::string::~string((string *)&outputType);
            std::__cxx11::stringstream::~stringstream((stringstream *)&out);
          }
          google::protobuf::RepeatedField<long>::~RepeatedField(&arrayOutputShape);
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&out);
          poVar5 = std::operator<<(local_1a0,"Unsupported array type \"");
          puVar7 = (undefined1 *)inputType.Type_;
          if (inputType._oneof_case_[0] != 5) {
            puVar7 = Specification::_ArrayFeatureType_default_instance_;
          }
          pcVar6 = MLArrayDataType_Name(((SequenceFeatureType *)puVar7)->_oneof_case_[0]);
          poVar5 = std::operator<<(poVar5,pcVar6);
          poVar5 = std::operator<<(poVar5,"\" for feature \"");
          pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &outputType,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(pTVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),"\". ");
          poVar5 = std::operator<<(poVar5,(string *)&outputType);
          poVar5 = std::operator<<(poVar5,"Should be of: ");
          poVar5 = std::operator<<(poVar5,"MLArrayDataTypeFLOAT32");
          poVar5 = std::operator<<(poVar5,".");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&outputType);
          std::__cxx11::stringbuf::str();
          Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                         (string *)&outputType);
          std::__cxx11::string::~string((string *)&outputType);
          std::__cxx11::stringstream::~stringstream((stringstream *)&out);
        }
        Specification::FeatureType::~FeatureType(&inputType);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&out);
        poVar5 = std::operator<<(local_1a0,
                                 "Incorrect input shape, should be 1-dimension, of length: ");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x3cf0);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                       (string *)&inputType);
        std::__cxx11::string::~string((string *)&inputType);
        std::__cxx11::stringstream::~stringstream((stringstream *)&out);
      }
      google::protobuf::RepeatedField<long>::~RepeatedField(&arrayInputShape);
    }
  }
  else {
LAB_00286746:
    Result::Result(__return_storage_ptr__,&result);
  }
  this_00 = (stringstream *)&result.m_message;
LAB_0028675e:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_soundAnalysisPreprocessing>(const Specification::Model &format) {
        const auto &interface = format.description();
        
        // make sure model is a sound analysis preprocessing
        if (!format.has_soundanalysispreprocessing()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a sound analysis preprocessing.");
        }
        
        Result result;
        
        // validate the inputs: only one input with multiarray type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }

        // validate the outputs: only one output with multiarray type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }

        // other validate logics here
        const auto &soundAnalysisPreprocessing = format.soundanalysispreprocessing();
        switch (soundAnalysisPreprocessing.SoundAnalysisPreprocessingType_case()) {
            case Specification::CoreMLModels::SoundAnalysisPreprocessing::kVggish:
            {
                // validate input shape for VGGish preprocessing
                auto arrayInputShape = interface.input(0).type().multiarraytype().shape();
                if (arrayInputShape.size() != 1 || arrayInputShape[0] != FRONTEND_PROCESSING_INPUT_LENGTH) {
                    std::stringstream out;
                    out << "Incorrect input shape, should be 1-dimension, of length: "<<FRONTEND_PROCESSING_INPUT_LENGTH<<std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                // validate input data type
                auto inputType = interface.input(0).type();
                if (inputType.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                    std::stringstream out;
                    out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(inputType.multiarraytype().datatype()))
                    << "\" for feature \"" << interface.input(0).name() + "\". "
                    << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(Specification::ArrayFeatureType_ArrayDataType_FLOAT32))
                    << "." << std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                // validate output shape
                auto arrayOutputShape = interface.output(0).type().multiarraytype().shape();
                if (arrayOutputShape.size() != 3 || arrayOutputShape[0] != 1
                    || arrayOutputShape[1] != FRONTEND_PROCESSING_OUTPUT_NUM_FRAMES
                    || arrayOutputShape[2] != FRONTEND_PROCESSING_OUTPUT_NUM_BANDS) {
                    std::stringstream out;
                    out << "Incorrect output shape, should be 3-dimension, of size: "<<1<<"x"<<FRONTEND_PROCESSING_OUTPUT_NUM_FRAMES<<"x"<<FRONTEND_PROCESSING_OUTPUT_NUM_BANDS<<std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                // validate output data type
                auto outputType = interface.output(0).type();
                if (outputType.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                    std::stringstream out;
                    out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(outputType.multiarraytype().datatype()))
                    << "\" for feature \"" << interface.input(0).name() + "\". "
                    << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(Specification::ArrayFeatureType_ArrayDataType_FLOAT32))
                    << "." << std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                break;
            }
            case Specification::CoreMLModels::SoundAnalysisPreprocessing::SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Type for sound analysis preprocessing not set");
        }
        
        return result;
    }